

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.cc
# Opt level: O1

void absl::cord_internal::CordRep::Destroy(CordRep *rep)

{
  RefcountAndFlags *pRVar1;
  byte bVar2;
  CordRepBtree *pCVar3;
  uint uVar4;
  
  if (rep == (CordRep *)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.cc"
                  ,0x28,"static void absl::cord_internal::CordRep::Destroy(CordRep *)");
  }
  uVar4 = (rep->refcount).count_.super___atomic_base<int>._M_i;
  while( true ) {
    if ((uVar4 & 1) != 0) {
      __assert_fail("!rep->refcount.IsImmortal()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.cc"
                    ,0x2b,"static void absl::cord_internal::CordRep::Destroy(CordRep *)");
    }
    bVar2 = (((CordRepBtree *)rep)->super_CordRep).tag;
    if (bVar2 != 1) break;
    pCVar3 = (CordRepBtree *)((CordRepBtree *)rep)->edges_[1];
    if ((CordRepBtree *)rep != (CordRepBtree *)0x0) {
      operator_delete(rep,0x20);
    }
    uVar4 = (pCVar3->super_CordRep).refcount.count_.super___atomic_base<int>._M_i;
    if ((uVar4 & 1) == 0 && (int)uVar4 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                    ,0xa1,"bool absl::cord_internal::RefcountAndFlags::Decrement()");
    }
    if (uVar4 != 2) {
      pRVar1 = &(pCVar3->super_CordRep).refcount;
      LOCK();
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((pRVar1->count_).super___atomic_base<int>._M_i != 0) {
        return;
      }
    }
    uVar4 = (pCVar3->super_CordRep).refcount.count_.super___atomic_base<int>._M_i;
    rep = (CordRep *)pCVar3;
  }
  if (bVar2 == 2) {
    CordRepCrc::Destroy((CordRepCrc *)rep);
    return;
  }
  if (bVar2 == 5) {
    if ((CordRepBtree *)rep == (CordRepBtree *)0x0) {
      __assert_fail("rep != nullptr && rep->IsExternal()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                    ,0x1b3,"static void absl::cord_internal::CordRepExternal::Delete(CordRep *)");
    }
    if (((CordRepBtree *)rep)->edges_[1] == (CordRep *)0x0) {
      __assert_fail("rep_external->releaser_invoker != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                    ,0x1b5,"static void absl::cord_internal::CordRepExternal::Delete(CordRep *)");
    }
    (*(code *)((CordRepBtree *)rep)->edges_[1])();
    return;
  }
  if (bVar2 == 3) {
    CordRepBtree::Destroy((CordRepBtree *)rep);
    return;
  }
  if (bVar2 < 6) {
    __assert_fail("rep->IsFlat()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.cc"
                  ,0x3d,"static void absl::cord_internal::CordRep::Destroy(CordRep *)");
  }
  CordRepFlat::Delete(rep);
  return;
}

Assistant:

void CordRep::Destroy(CordRep* rep) {
  assert(rep != nullptr);

  while (true) {
    assert(!rep->refcount.IsImmortal());
    if (rep->tag == BTREE) {
      CordRepBtree::Destroy(rep->btree());
      return;
    } else if (rep->tag == EXTERNAL) {
      CordRepExternal::Delete(rep);
      return;
    } else if (rep->tag == SUBSTRING) {
      CordRepSubstring* rep_substring = rep->substring();
      rep = rep_substring->child;
      delete rep_substring;
      if (rep->refcount.Decrement()) {
        return;
      }
    } else if (rep->tag == CRC) {
      CordRepCrc::Destroy(rep->crc());
      return;
    } else {
      assert(rep->IsFlat());
      CordRepFlat::Delete(rep);
      return;
    }
  }
}